

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_UnPredictPlayer(void)

{
  APlayerPawn *this;
  sector_t *psVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  sector_t_conflict *s;
  undefined1 nextnode [8];
  uint uVar4;
  AActor **ppAVar5;
  sector_t_conflict **ppsVar6;
  msecnode_t **ppmVar7;
  long lVar8;
  long lVar9;
  FBlockNode *local_88;
  FBlockNode *block;
  msecnode_t *snode;
  msecnode_t *node;
  AActor **link;
  AActor *next;
  AActor *me;
  sector_t_conflict *sec;
  undefined1 local_48 [8];
  FLinkContext ctx;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aStack_30;
  int inventorytics;
  TObjPtr<AInventory> InvSel;
  AActor *savedcamera;
  APlayerPawn *act;
  uint i;
  player_t *player;
  
  lVar8 = (long)consoleplayer;
  lVar9 = lVar8 * 0x2a0;
  if ((*(uint *)(&DAT_01ae71a8 + lVar9) & 0x2000) != 0) {
    this = ((player_t *)(&players + lVar8 * 0x54))->mo;
    InvSel.field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)
         TObjPtr::operator_cast_to_AActor_((TObjPtr *)(&DAT_01ae7238 + lVar9));
    TObjPtr<AInventory>::TObjPtr((TObjPtr<AInventory> *)&stack0xffffffffffffffd0,&this->InvSel);
    ctx.render_list._4_4_ = *(undefined4 *)(&DAT_01ae715c + lVar9);
    player_t::operator=((player_t *)(&players + lVar8 * 0x54),&PredictionPlayerBackup);
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(&DAT_01ae7238 + lVar9),(AActor *)InvSel.field_0);
    FLinkContext::FLinkContext((FLinkContext *)local_48);
    AActor::UnlinkFromWorld(&this->super_AActor,(FLinkContext *)local_48);
    memcpy(&(this->super_AActor).snext,PredictionActorBackup,0x530);
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&sec + 4),
               (int)this +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&sec + 4));
    if (uVar4 == 0) {
      psVar1 = (this->super_AActor).Sector;
      psVar1->thinglist = (AActor *)0x0;
      act._4_4_ = TArray<AActor_*,_AActor_*>::Size(&PredictionSectorListBackup);
      while (act._4_4_ != 0) {
        ppAVar5 = TArray<AActor_*,_AActor_*>::operator[]
                            (&PredictionSectorListBackup,(ulong)(act._4_4_ - 1));
        pAVar2 = *ppAVar5;
        ppAVar5 = &psVar1->thinglist;
        pAVar3 = *ppAVar5;
        pAVar2->snext = pAVar3;
        if (pAVar3 != (AActor *)0x0) {
          pAVar3->sprev = &pAVar2->snext;
        }
        pAVar2->sprev = ppAVar5;
        *ppAVar5 = pAVar2;
        act._4_4_ = act._4_4_ - 1;
      }
      for (snode = (msecnode_t *)local_48; snode != (msecnode_t *)0x0; snode = snode->m_tnext) {
        snode->m_thing = (AActor *)0x0;
      }
      P_DelSeclist((msecnode_t *)local_48,0x1c0);
      local_48 = (undefined1  [8])0x0;
      act._4_4_ = TArray<sector_t_*,_sector_t_*>::Size(&PredictionTouchingSectorsBackup);
      while (uVar4 = act._4_4_ - 1, act._4_4_ != 0) {
        ppsVar6 = TArray<sector_t_*,_sector_t_*>::operator[]
                            (&PredictionTouchingSectorsBackup,(ulong)uVar4);
        nextnode = local_48;
        s = *ppsVar6;
        ppsVar6 = TArray<sector_t_*,_sector_t_*>::operator[]
                            (&PredictionTouchingSectorsBackup,(ulong)uVar4);
        local_48 = (undefined1  [8])
                   P_AddSecnode(s,&this->super_AActor,(msecnode_t *)nextnode,
                                &(*ppsVar6)->touching_thinglist);
        act._4_4_ = uVar4;
      }
      (this->super_AActor).touching_sectorlist = (msecnode_t *)local_48;
      local_48 = (undefined1  [8])0x0;
      snode = (msecnode_t *)0x0;
      while (snode != (msecnode_t *)0x0) {
        if (snode->m_thing == (AActor *)0x0) {
          if ((undefined1  [8])snode == local_48) {
            local_48 = (undefined1  [8])snode->m_tnext;
          }
          snode = P_DelSecnode(snode,0x1c0);
        }
        else {
          snode = snode->m_tnext;
        }
      }
      act._4_4_ = TArray<sector_t_*,_sector_t_*>::Size(&PredictionTouchingSectorsBackup);
LAB_00622ae5:
      uVar4 = act._4_4_ - 1;
      if (act._4_4_ != 0) {
        ppmVar7 = TArray<msecnode_t_*,_msecnode_t_*>::operator[]
                            (&PredictionSector_sprev_Backup,(ulong)uVar4);
        act._4_4_ = uVar4;
        if (*ppmVar7 != (msecnode_t *)0x0) {
          ppsVar6 = TArray<sector_t_*,_sector_t_*>::operator[]
                              (&PredictionTouchingSectorsBackup,(ulong)uVar4);
          for (block = (FBlockNode *)(*ppsVar6)->touching_thinglist; block != (FBlockNode *)0x0;
              block = block->NextBlock) {
            if (*(APlayerPawn **)&block->BlockIndex == this) {
              if (block->PrevBlock == (FBlockNode **)0x0) {
                *(FBlockNode **)&block->Me->flags2 = block->NextBlock;
              }
              else {
                block->PrevBlock[5] = block->NextBlock;
              }
              if (block->NextBlock != (FBlockNode *)0x0) {
                block->NextBlock->PrevBlock = block->PrevBlock;
              }
              ppmVar7 = TArray<msecnode_t_*,_msecnode_t_*>::operator[]
                                  (&PredictionSector_sprev_Backup,(ulong)uVar4);
              block->PrevBlock = (FBlockNode **)*ppmVar7;
              if (block->PrevBlock[5] != (FBlockNode *)0x0) {
                block->PrevBlock[5]->PrevBlock = (FBlockNode **)block;
              }
              block->NextBlock = block->PrevBlock[5];
              block->PrevBlock[5] = block;
              break;
            }
          }
        }
        goto LAB_00622ae5;
      }
    }
    for (local_88 = (this->super_AActor).BlockNode; local_88 != (FBlockNode *)0x0;
        local_88 = local_88->NextBlock) {
      *local_88->PrevActor = local_88;
      if (local_88->NextActor != (FBlockNode *)0x0) {
        local_88->NextActor->PrevActor = &local_88->NextActor;
      }
    }
    (this->InvSel).field_0 = aStack_30;
    *(undefined4 *)(&DAT_01ae715c + lVar9) = ctx.render_list._4_4_;
  }
  return;
}

Assistant:

void P_UnPredictPlayer ()
{
	player_t *player = &players[consoleplayer];

	if (player->cheats & CF_PREDICTING)
	{
		unsigned int i;
		APlayerPawn *act = player->mo;
		AActor *savedcamera = player->camera;

		TObjPtr<AInventory> InvSel = act->InvSel;
		int inventorytics = player->inventorytics;

		*player = PredictionPlayerBackup;

		// Restore the camera instead of using the backup's copy, because spynext/prev
		// could cause it to change during prediction.
		player->camera = savedcamera;

		FLinkContext ctx;
		act->UnlinkFromWorld(&ctx);
		memcpy(&act->snext, PredictionActorBackup, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

		// The blockmap ordering needs to remain unchanged, too.
		// Restore sector links and refrences.
		// [ED850] This is somewhat of a duplicate of LinkToWorld(), but we need to keep every thing the same,
		// otherwise we end up fixing bugs in blockmap logic (i.e undefined behaviour with polyobject collisions),
		// which we really don't want to do here.
		if (!(act->flags & MF_NOSECTOR))
		{
			sector_t *sec = act->Sector;
			AActor *me, *next;
			AActor **link;// , **prev;

			// The thinglist is just a pointer chain. We are restoring the exact same things, so we can NULL the head safely
			sec->thinglist = NULL;

			for (i = PredictionSectorListBackup.Size(); i-- > 0;)
			{
				me = PredictionSectorListBackup[i];
				link = &sec->thinglist;
				next = *link;
				if ((me->snext = next))
					next->sprev = &me->snext;
				me->sprev = link;
				*link = me;
			}

			// Destroy old refrences
			msecnode_t *node = ctx.sector_list;
			while (node)
			{
				node->m_thing = NULL;
				node = node->m_tnext;
			}

			// Make the sector_list match the player's touching_sectorlist before it got predicted.
			P_DelSeclist(ctx.sector_list, &sector_t::touching_thinglist);
			ctx.sector_list = NULL;
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				ctx.sector_list = P_AddSecnode(PredictionTouchingSectorsBackup[i], act, ctx.sector_list, PredictionTouchingSectorsBackup[i]->touching_thinglist);
			}
			act->touching_sectorlist = ctx.sector_list;	// Attach to thing
			ctx.sector_list = NULL;		// clear for next time

			// Huh???
			node = ctx.sector_list;
			while (node)
			{
				if (node->m_thing == NULL)
				{
					if (node == ctx.sector_list)
						ctx.sector_list = node->m_tnext;
					node = P_DelSecnode(node, &sector_t::touching_thinglist);
				}
				else
				{
					node = node->m_tnext;
				}
			}

			msecnode_t *snode;

			// Restore sector thinglist order
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				// If we were already the head node, then nothing needs to change
				if (PredictionSector_sprev_Backup[i] == NULL)
					continue;

				for (snode = PredictionTouchingSectorsBackup[i]->touching_thinglist; snode; snode = snode->m_snext)
				{
					if (snode->m_thing == act)
					{
						if (snode->m_sprev)
							snode->m_sprev->m_snext = snode->m_snext;
						else
							snode->m_sector->touching_thinglist = snode->m_snext;
						if (snode->m_snext)
							snode->m_snext->m_sprev = snode->m_sprev;

						snode->m_sprev = PredictionSector_sprev_Backup[i];

						// At the moment, we don't exist in the list anymore, but we do know what our previous node is, so we set its current m_snext->m_sprev to us.
						if (snode->m_sprev->m_snext)
							snode->m_sprev->m_snext->m_sprev = snode;
						snode->m_snext = snode->m_sprev->m_snext;
						snode->m_sprev->m_snext = snode;
						break;
					}
				}
			}
		}

		// Now fix the pointers in the blocknode chain
		FBlockNode *block = act->BlockNode;

		while (block != NULL)
		{
			*(block->PrevActor) = block;
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = &block->NextActor;
			}
			block = block->NextBlock;
		}

		act->InvSel = InvSel;
		player->inventorytics = inventorytics;
	}
}